

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O3

void soul::Optimisations::recursivelyFlagStructUse(Type *type)

{
  size_t sVar1;
  Structure *pSVar2;
  Member *m;
  Member *type_00;
  long lVar3;
  Type TStack_28;
  
  if (type->category == array) {
    Type::getArrayElementType(&TStack_28,type);
    recursivelyFlagStructUse(&TStack_28);
    RefCountedPtr<soul::Structure>::decIfNotNull(TStack_28.structure.object);
  }
  else if ((type->category == structure) &&
          (pSVar2 = Type::getStructRef(type), pSVar2->activeUseFlag == false)) {
    pSVar2 = Type::getStructRef(type);
    pSVar2->activeUseFlag = true;
    pSVar2 = Type::getStructRef(type);
    sVar1 = (pSVar2->members).numActive;
    if (sVar1 != 0) {
      type_00 = (pSVar2->members).items;
      lVar3 = sVar1 << 6;
      do {
        recursivelyFlagStructUse(&type_00->type);
        type_00 = type_00 + 1;
        lVar3 = lVar3 + -0x40;
      } while (lVar3 != 0);
    }
  }
  return;
}

Assistant:

static void recursivelyFlagStructUse (const Type& type)
    {
        if (type.isStruct())
        {
            if (! type.getStructRef().activeUseFlag)
            {
                type.getStructRef().activeUseFlag = true;

                for (auto& m : type.getStructRef().getMembers())
                    recursivelyFlagStructUse (m.type);
            }
        }
        else if (type.isArray())
        {
            recursivelyFlagStructUse (type.getArrayElementType());
        }
    }